

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

void __thiscall position::undo_move(position *this,Move *m)

{
  U64 UVar1;
  int iVar2;
  Piece local_70 [2];
  Square local_68;
  Square local_64;
  Square rt_1;
  Square rf_1;
  Square local_58;
  Square local_54;
  Square rf;
  Square rt;
  Piece local_48 [3];
  Square local_3c;
  Color local_38;
  Color local_34;
  Piece local_30;
  Color local_2c;
  Piece cp;
  Color us;
  Piece p;
  Movetype t;
  Square to;
  Square from;
  Move *m_local;
  position *this_local;
  
  t = (Movetype)m->t;
  p = (Piece)m->f;
  us = (Color)m->type;
  _to = m;
  m_local = (Move *)this;
  cp = piece_on(this,&t);
  local_2c = to_move(this);
  local_2c = local_2c ^ black;
  local_30 = (this->ifo).captured;
  if (us == 10) {
    piece_data::do_quiet(&this->pcs,&local_2c,&cp,&t,&p,&this->ifo);
  }
  else if (us == 0xb) {
    piece_data::do_quiet(&this->pcs,&local_2c,&cp,&t,&p,&this->ifo);
    local_34 = to_move(this);
    piece_data::add_piece(&this->pcs,&local_34,&local_30,&t,&this->ifo);
  }
  else if (us == 0xc) {
    piece_data::do_quiet(&this->pcs,&local_2c,&cp,&t,&p,&this->ifo);
    local_38 = to_move(this);
    iVar2 = 8;
    if (local_2c == white) {
      iVar2 = -8;
    }
    local_3c = t + iVar2;
    piece_data::add_piece(&this->pcs,&local_38,&local_30,&local_3c,&this->ifo);
  }
  else if ((int)us < 4) {
    local_48[2] = piece_on(this,&t);
    piece_data::remove_piece(&this->pcs,&local_2c,local_48 + 2,&t,&this->ifo);
    local_48[1] = 0;
    piece_data::add_piece(&this->pcs,&local_2c,local_48 + 1,&p,&this->ifo);
  }
  else if ((int)us < 8) {
    local_48[0] = piece_on(this,&t);
    piece_data::remove_piece(&this->pcs,&local_2c,local_48,&t,&this->ifo);
    rt = to_move(this);
    piece_data::add_piece(&this->pcs,&rt,&local_30,&t,&this->ifo);
    rf = A1;
    piece_data::add_piece(&this->pcs,&local_2c,&rf,&p,&this->ifo);
  }
  else if (us == 8) {
    local_54 = H8;
    if (local_2c == white) {
      local_54 = H1;
    }
    local_58 = F8;
    if (local_2c == white) {
      local_58 = F1;
    }
    rf_1 = F1;
    piece_data::do_quiet(&this->pcs,&local_2c,&rf_1,&t,&p,&this->ifo);
    rt_1 = D1;
    piece_data::do_quiet(&this->pcs,&local_2c,&rt_1,&local_58,&local_54,&this->ifo);
  }
  else if (us == 9) {
    local_64 = D8;
    if (local_2c == white) {
      local_64 = D1;
    }
    local_68 = A8;
    if (local_2c == white) {
      local_68 = A1;
    }
    local_70[1] = 5;
    piece_data::do_quiet(&this->pcs,&local_2c,local_70 + 1,&t,&p,&this->ifo);
    local_70[0] = rook;
    piece_data::do_quiet(&this->pcs,&local_2c,local_70,&local_64,&local_68,&this->ifo);
  }
  UVar1 = this->hidx;
  this->hidx = UVar1 - 1;
  memcpy(&this->ifo,this->history + (UVar1 - 1),0x60);
  return;
}

Assistant:

void position::undo_move(const Move& m) {
	const Square from = Square(m.t);
	const Square to = Square(m.f);
	const Movetype t = Movetype(m.type);
	const Piece p = piece_on(from);
	const Color us = Color(to_move() ^ 1);
	Piece cp = ifo.captured;

	if (t == quiet) pcs.do_quiet(us, p, from, to, ifo);

	else if (t == capture) {
		pcs.do_quiet(us, p, from, to, ifo);
		pcs.add_piece(to_move(), cp, from, ifo);
	}

	else if (t == ep) {
		pcs.do_quiet(us, p, from, to, ifo);
		pcs.add_piece(to_move(), cp, Square(from + (us == white ? -8 : 8)), ifo);
	}

	else if (t < capture_promotion_q) {
		pcs.remove_piece(us, piece_on(from), from, ifo);
		pcs.add_piece(us, pawn, to, ifo);
	}

	else if (t < castle_ks) {
		pcs.remove_piece(us, piece_on(from), from, ifo);
		pcs.add_piece(to_move(), cp, from, ifo);
		pcs.add_piece(us, pawn, to, ifo);
	}

	else if (t == castle_ks) {
		Square rt = (us == white ? H1 : H8);
		Square rf = (us == white ? F1 : F8);
		pcs.do_quiet(us, king, from, to, ifo);
		pcs.do_quiet(us, rook, rf, rt, ifo);
	}

	else if (t == castle_qs) {
		Square rf = (us == white ? D1 : D8);
		Square rt = (us == white ? A1 : A8);
		pcs.do_quiet(us, king, from, to, ifo);
		pcs.do_quiet(us, rook, rf, rt, ifo);
	}
	ifo = history[--hidx];
}